

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall glslang::TSymbolTable::copyTable(TSymbolTable *this,TSymbolTable *copyOf)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference ppTVar4;
  undefined4 extraout_var;
  void *__child_stack;
  __fn *__fn;
  void *in_R8;
  value_type local_28;
  uint local_1c;
  TSymbolTable *pTStack_18;
  uint i;
  TSymbolTable *copyOf_local;
  TSymbolTable *this_local;
  
  pTStack_18 = copyOf;
  copyOf_local = this;
  if (this->adoptedLevels == copyOf->adoptedLevels) {
    this->uniqueId = copyOf->uniqueId;
    this->noBuiltInRedeclarations = (bool)(copyOf->noBuiltInRedeclarations & 1);
    this->separateNameSpaces = (bool)(copyOf->separateNameSpaces & 1);
    local_1c = copyOf->adoptedLevels;
    while( true ) {
      uVar2 = (ulong)local_1c;
      sVar3 = std::
              vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
              size(&pTStack_18->table);
      if (sVar3 <= uVar2) break;
      __fn = (__fn *)(ulong)local_1c;
      ppTVar4 = std::
                vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                ::operator[](&pTStack_18->table,(size_type)__fn);
      iVar1 = TSymbolTableLevel::clone(*ppTVar4,__fn,__child_stack,(int)sVar3,in_R8);
      local_28 = (value_type)CONCAT44(extraout_var,iVar1);
      std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
      push_back(&this->table,&local_28);
      local_1c = local_1c + 1;
    }
    return;
  }
  __assert_fail("adoptedLevels == copyOf.adoptedLevels",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.cpp"
                ,0x1eb,"void glslang::TSymbolTable::copyTable(const TSymbolTable &)");
}

Assistant:

void TSymbolTable::copyTable(const TSymbolTable& copyOf)
{
    assert(adoptedLevels == copyOf.adoptedLevels);

    uniqueId = copyOf.uniqueId;
    noBuiltInRedeclarations = copyOf.noBuiltInRedeclarations;
    separateNameSpaces = copyOf.separateNameSpaces;
    for (unsigned int i = copyOf.adoptedLevels; i < copyOf.table.size(); ++i)
        table.push_back(copyOf.table[i]->clone());
}